

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_tattle(REF_GRID ref_grid,REF_INT node)

{
  REF_GEOM ref_geom_00;
  REF_NODE pRVar1;
  REF_FACELIFT ref_facelift_00;
  REF_STATUS node_00;
  uint uVar2;
  REF_INT local_1b8;
  REF_INT local_1b0;
  int local_1ac;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT tri_nodes [27];
  REF_INT tuv_sense;
  REF_INT linear_nodes [27];
  REF_DBL faceuv [2];
  REF_DBL xyz [3];
  REF_DBL RStack_78;
  REF_INT cell;
  REF_DBL bary [3];
  REF_DBL local_58;
  REF_DBL params [2];
  REF_INT id;
  REF_INT type;
  REF_INT geom;
  REF_INT item;
  REF_FACELIFT ref_facelift;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_geom_00 = ref_grid->geom;
  pRVar1 = ref_grid->node;
  ref_facelift_00 = ref_geom_00->ref_facelift;
  if ((ref_facelift_00 != (REF_FACELIFT)0x0) && (ref_facelift_00->displacement == (REF_DBL *)0x0)) {
    printf(" facelift tattle on node = %d at %f %f %f\n",pRVar1->real[node * 0xf],
           pRVar1->real[node * 0xf + 1],pRVar1->real[node * 0xf + 2],(ulong)(uint)node);
    if ((node < 0) || (ref_geom_00->ref_adj->nnode <= node)) {
      local_1ac = -1;
    }
    else {
      local_1ac = ref_geom_00->ref_adj->first[node];
    }
    type = local_1ac;
    if (local_1ac == -1) {
      local_1b0 = -1;
    }
    else {
      local_1b0 = ref_geom_00->ref_adj->item[local_1ac].ref;
    }
    id = local_1b0;
    while (type != -1) {
      params[1]._4_4_ = ref_geom_00->descr[id * 6];
      params[1]._0_4_ = ref_geom_00->descr[(long)(id * 6) + 1];
      if (params[1]._4_4_ == 1) {
        local_58 = ref_geom_00->param[id << 1];
        uVar2 = ref_facelift_eval_at
                          (ref_facelift_00,1,params[1]._0_4_,&local_58,faceuv + 1,(REF_DBL *)0x0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0xd4,"ref_facelift_tattle",(ulong)uVar2,"eval");
          return uVar2;
        }
        uVar2 = ref_facelift_enclosing
                          (ref_facelift_00,params[1]._4_4_,params[1]._0_4_,&local_58,
                           (REF_INT *)((long)xyz + 0x14),&stack0xffffffffffffff88);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0xd6,"ref_facelift_tattle",(ulong)uVar2,"enclose");
          return uVar2;
        }
        printf("edg id %d xyz %f %f %f bary %f %f\n",faceuv[1],xyz[0],xyz[1],RStack_78,bary[0],
               (ulong)params[1]._0_4_);
      }
      else if (params[1]._4_4_ == 2) {
        local_58 = ref_geom_00->param[id << 1];
        params[0] = ref_geom_00->param[id * 2 + 1];
        uVar2 = ref_facelift_eval_at
                          (ref_facelift_00,2,params[1]._0_4_,&local_58,faceuv + 1,(REF_DBL *)0x0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0xde,"ref_facelift_tattle",(ulong)uVar2,"eval");
          return uVar2;
        }
        uVar2 = ref_facelift_enclosing
                          (ref_facelift_00,params[1]._4_4_,params[1]._0_4_,&local_58,
                           (REF_INT *)((long)xyz + 0x14),&stack0xffffffffffffff88);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0xe0,"ref_facelift_tattle",(ulong)uVar2,"enclose");
          return uVar2;
        }
        printf("tri id %d xyz %f %f %f uv %f %f\n",faceuv[1],xyz[0],xyz[1],local_58,params[0],
               (ulong)params[1]._0_4_);
        uVar2 = ref_cell_nodes(ref_facelift_00->tri_cell,xyz[2]._4_4_,&ref_private_macro_code_rss_1)
        ;
        node_00 = ref_private_macro_code_rss;
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0xe4,"ref_facelift_tattle",(ulong)uVar2,"edg tri nodes");
          return uVar2;
        }
        tri_nodes[0x1a] = ref_private_macro_code_rss_1;
        linear_nodes[0] = tri_nodes[0];
        linear_nodes[1] = (&ref_private_macro_code_rss_1)[ref_facelift_00->tri_cell->node_per];
        uVar2 = ref_geom_cell_tuv(ref_geom_00,ref_private_macro_code_rss_1,tri_nodes + 0x1a,2,
                                  (REF_DBL *)(linear_nodes + 0x1a),tri_nodes + 0x19);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0xec,"ref_facelift_tattle",(ulong)uVar2,"face uv");
          return uVar2;
        }
        printf("bary[0] %f uv %f %f\n",RStack_78,stack0xffffffffffffff58,faceuv[0]);
        uVar2 = ref_geom_cell_tuv(ref_geom_00,node_00,tri_nodes + 0x1a,2,
                                  (REF_DBL *)(linear_nodes + 0x1a),tri_nodes + 0x19);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0xf0,"ref_facelift_tattle",(ulong)uVar2,"face uv");
          return uVar2;
        }
        printf("bary[1] %f uv %f %f\n",bary[0],stack0xffffffffffffff58,faceuv[0]);
        uVar2 = ref_geom_cell_tuv(ref_geom_00,linear_nodes[0],tri_nodes + 0x1a,2,
                                  (REF_DBL *)(linear_nodes + 0x1a),tri_nodes + 0x19);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0xf4,"ref_facelift_tattle",(ulong)uVar2,"face uv");
          return uVar2;
        }
        printf("bary[2] %f uv %f %f\n",bary[1],stack0xffffffffffffff58,faceuv[0]);
      }
      type = ref_geom_00->ref_adj->item[type].next;
      if (type == -1) {
        local_1b8 = -1;
      }
      else {
        local_1b8 = ref_geom_00->ref_adj->item[type].ref;
      }
      id = local_1b8;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_tattle(REF_GRID ref_grid, REF_INT node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_FACELIFT ref_facelift = ref_geom_facelift(ref_geom);
  REF_INT item, geom;
  REF_INT type, id;
  REF_DBL params[2];
  REF_DBL bary[3];
  REF_INT cell;
  REF_DBL xyz[3], faceuv[2];
  REF_INT linear_nodes[REF_CELL_MAX_SIZE_PER], tuv_sense;
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];

  if (NULL == ref_facelift) return REF_SUCCESS;
  if (!ref_facelift_direct(ref_facelift)) return REF_SUCCESS;

  printf(" facelift tattle on node = %d at %f %f %f\n", node,
         ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
         ref_node_xyz(ref_node, 2, node));
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    type = ref_geom_type(ref_geom, geom);
    id = ref_geom_id(ref_geom, geom);
    switch (type) {
      case REF_GEOM_EDGE:
        params[0] = ref_geom_param(ref_geom, 0, geom);
        RSS(ref_facelift_eval_at(ref_facelift, type, id, params, xyz, NULL),
            "eval");
        RSS(ref_facelift_enclosing(ref_facelift, type, id, params, &cell, bary),
            "enclose");
        printf("edg id %d xyz %f %f %f bary %f %f\n", id, xyz[0], xyz[1],
               xyz[2], bary[0], bary[1]);
        break;
      case REF_GEOM_FACE:
        params[0] = ref_geom_param(ref_geom, 0, geom);
        params[1] = ref_geom_param(ref_geom, 1, geom);
        RSS(ref_facelift_eval_at(ref_facelift, type, id, params, xyz, NULL),
            "eval");
        RSS(ref_facelift_enclosing(ref_facelift, type, id, params, &cell, bary),
            "enclose");
        printf("tri id %d xyz %f %f %f uv %f %f\n", id, xyz[0], xyz[1], xyz[2],
               params[0], params[1]);
        RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), cell, tri_nodes),
            "edg tri nodes");
        linear_nodes[0] = tri_nodes[0];
        linear_nodes[1] = tri_nodes[1];
        linear_nodes[2] = tri_nodes[2];
        linear_nodes[3] =
            tri_nodes[ref_cell_id_index(ref_facelift_tri(ref_facelift))];
        RSS(ref_geom_cell_tuv(ref_geom, linear_nodes[0], linear_nodes,
                              REF_GEOM_FACE, faceuv, &tuv_sense),
            "face uv");
        printf("bary[0] %f uv %f %f\n", bary[0], faceuv[0], faceuv[1]);
        RSS(ref_geom_cell_tuv(ref_geom, linear_nodes[1], linear_nodes,
                              REF_GEOM_FACE, faceuv, &tuv_sense),
            "face uv");
        printf("bary[1] %f uv %f %f\n", bary[1], faceuv[0], faceuv[1]);
        RSS(ref_geom_cell_tuv(ref_geom, linear_nodes[2], linear_nodes,
                              REF_GEOM_FACE, faceuv, &tuv_sense),
            "face uv");
        printf("bary[2] %f uv %f %f\n", bary[2], faceuv[0], faceuv[1]);

        break;
    }
  }

  return REF_SUCCESS;
}